

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 5_handler_from_function.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  JNIEnv jvm;
  JNIEnv local_14;
  
  *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) | 1;
  f(&local_14);
  poVar1 = std::ostream::_M_insert<bool>(true);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  g(&local_14);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main()
{
   JNIEnv jvm;
   std::cout << std::boolalpha << f(&jvm) << std::endl << g(&jvm) << std::endl;
	return EXIT_SUCCESS;
}